

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_hlt_x86_64(CPUX86State *env,int next_eip_addend)

{
  CPUX86State *__mptr;
  uintptr_t unaff_retaddr;
  
  cpu_svm_check_intercept_param_x86_64(env,0x78,0,unaff_retaddr);
  env->eip = env->eip + (long)next_eip_addend;
  do_hlt((X86CPU *)(env[-6].mtrr_var + 4));
  return;
}

Assistant:

void helper_hlt(CPUX86State *env, int next_eip_addend)
{
    X86CPU *cpu = env_archcpu(env);

    cpu_svm_check_intercept_param(env, SVM_EXIT_HLT, 0, GETPC());
    env->eip += next_eip_addend;

    do_hlt(cpu);
}